

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error ignoreSectionProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Error XVar1;
  char *local_20;
  
  local_20 = start;
  XVar1 = doIgnoreSection(parser,parser->m_encoding,&local_20,end,endPtr,
                          (parser->m_parsingStatus).finalBuffer == '\0');
  if (XVar1 == XML_ERROR_NONE) {
    if (local_20 != (char *)0x0) {
      parser->m_processor = prologProcessor;
      XVar1 = prologProcessor(parser,local_20,end,endPtr);
      return XVar1;
    }
    XVar1 = XML_ERROR_NONE;
  }
  return XVar1;
}

Assistant:

static enum XML_Error PTRCALL
ignoreSectionProcessor(XML_Parser parser, const char *start, const char *end,
                       const char **endPtr) {
  enum XML_Error result
      = doIgnoreSection(parser, parser->m_encoding, &start, end, endPtr,
                        (XML_Bool)! parser->m_parsingStatus.finalBuffer);
  if (result != XML_ERROR_NONE)
    return result;
  if (start) {
    parser->m_processor = prologProcessor;
    return prologProcessor(parser, start, end, endPtr);
  }
  return result;
}